

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_si_iec_units.cpp
# Opt level: O1

bool tlx::parse_si_iec_units(char *str,uint64_t *out_size,char default_unit)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  byte bVar7;
  uint64_t uVar8;
  byte *local_20;
  
  uVar4 = strtoul(str,(char **)&local_20,10);
  *out_size = uVar4;
  if (local_20 == (byte *)0x0) {
    return false;
  }
  for (; bVar7 = *local_20, bVar7 == 0x20; local_20 = local_20 + 1) {
  }
  if (bVar7 < 0x67) {
    switch(bVar7) {
    case 0x4b:
switchD_00150f69_caseD_4b:
      iVar3 = 1;
      break;
    case 0x4c:
    case 0x4e:
    case 0x4f:
    case 0x51:
    case 0x52:
    case 0x53:
      goto switchD_00150f69_caseD_4c;
    case 0x4d:
switchD_00150f69_caseD_4d:
      iVar3 = 2;
      break;
    case 0x50:
switchD_00150f69_caseD_50:
      iVar3 = 5;
      break;
    case 0x54:
switchD_00150f69_caseD_54:
      iVar3 = 4;
      break;
    default:
      if (bVar7 != 0x47) goto switchD_00150f69_caseD_4c;
LAB_00150fdd:
      iVar3 = 3;
    }
    local_20 = local_20 + 1;
    bVar7 = 1;
    bVar2 = false;
  }
  else {
    switch(bVar7) {
    case 0x6b:
      goto switchD_00150f69_caseD_4b;
    case 0x6c:
    case 0x6e:
    case 0x6f:
    case 0x71:
    case 0x72:
    case 0x73:
      break;
    case 0x6d:
      goto switchD_00150f69_caseD_4d;
    case 0x70:
      goto switchD_00150f69_caseD_50;
    case 0x74:
      goto switchD_00150f69_caseD_54;
    default:
      if (bVar7 == 0x67) goto LAB_00150fdd;
    }
switchD_00150f69_caseD_4c:
    bVar7 = 0;
    bVar2 = true;
    iVar3 = 0;
  }
  if (*local_20 == 0x69) {
    uVar5 = 1000;
    if (!bVar2) {
LAB_00151017:
      local_20 = local_20 + 1;
      uVar5 = 0x400;
    }
  }
  else {
    uVar5 = 1000;
    if ((bool)(bVar7 & *local_20 == 0x49)) goto LAB_00151017;
  }
  if ((*local_20 | 0x20) == 0x62) {
    local_20 = local_20 + 1;
  }
  else if (bVar2) {
    iVar6 = (int)default_unit;
    iVar3 = 0;
    if (iVar6 < 0x67) {
      iVar3 = 0;
      switch(iVar6) {
      case 0x4b:
        iVar3 = 1;
        break;
      case 0x4c:
      case 0x4e:
      case 0x4f:
      case 0x51:
      case 0x52:
      case 0x53:
        goto switchD_0015109b_caseD_4c;
      case 0x4d:
        iVar3 = 2;
        break;
      case 0x50:
        iVar3 = 5;
        break;
      case 0x54:
        iVar3 = 4;
        break;
      default:
        if (iVar6 != 0x47) goto switchD_0015109b_caseD_4c;
        iVar3 = 3;
      }
      uVar5 = 0x400;
    }
    else {
      switch(iVar6) {
      case 0x6b:
        iVar3 = 1;
        break;
      case 0x6c:
      case 0x6e:
      case 0x6f:
      case 0x71:
      case 0x72:
      case 0x73:
        goto switchD_0015109b_caseD_4c;
      case 0x6d:
        iVar3 = 2;
        break;
      case 0x70:
        iVar3 = 5;
        break;
      case 0x74:
        iVar3 = 4;
        break;
      default:
        if (iVar6 != 0x67) goto switchD_0015109b_caseD_4c;
        iVar3 = 3;
      }
      uVar5 = 1000;
    }
  }
switchD_0015109b_caseD_4c:
  local_20 = local_20 + -1;
  do {
    pbVar1 = local_20 + 1;
    local_20 = local_20 + 1;
  } while (*pbVar1 == 0x20);
  if (iVar3 != 0) {
    uVar8 = *out_size;
    do {
      uVar8 = uVar8 * uVar5;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    *out_size = uVar8;
  }
  return *local_20 == 0;
}

Assistant:

bool parse_si_iec_units(
    const char* str, uint64_t* out_size, char default_unit) {

    char* endptr;
    *out_size = strtoul(str, &endptr, 10);
    if (endptr == nullptr) return false;        // parse failed, no number

    while (*endptr == ' ') ++endptr;            // skip over spaces

    // multiply with base ^ power
    unsigned int base = 1000;
    unsigned int power = 0;

    if (*endptr == 'k' || *endptr == 'K')
        power = 1, ++endptr;
    else if (*endptr == 'm' || *endptr == 'M')
        power = 2, ++endptr;
    else if (*endptr == 'g' || *endptr == 'G')
        power = 3, ++endptr;
    else if (*endptr == 't' || *endptr == 'T')
        power = 4, ++endptr;
    else if (*endptr == 'p' || *endptr == 'P')
        power = 5, ++endptr;

    // switch to power of two (only if power was set above)
    if ((*endptr == 'i' || *endptr == 'I') && power != 0)
        base = 1024, ++endptr;

    // byte indicator
    if (*endptr == 'b' || *endptr == 'B') {
        ++endptr;
    }
    else if (power == 0)
    {
        // no explicit power indicator, and no 'b' or 'B' -> apply default unit
        switch (default_unit)
        {
        default: break;
        case 'k': power = 1, base = 1000;
            break;
        case 'm': power = 2, base = 1000;
            break;
        case 'g': power = 3, base = 1000;
            break;
        case 't': power = 4, base = 1000;
            break;
        case 'p': power = 5, base = 1000;
            break;
        case 'K': power = 1, base = 1024;
            break;
        case 'M': power = 2, base = 1024;
            break;
        case 'G': power = 3, base = 1024;
            break;
        case 'T': power = 4, base = 1024;
            break;
        case 'P': power = 5, base = 1024;
            break;
        }
    }

    // skip over spaces
    while (*endptr == ' ') ++endptr;

    // multiply size
    for (unsigned int p = 0; p < power; ++p)
        *out_size *= base;

    return (*endptr == 0);
}